

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O1

uint32_t reconstructDFDBytesPlane0FromSamples(uint32_t *DFD)

{
  ulong uVar1;
  uint32_t *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar5 = DFD[7];
  uVar4 = (DFD[2] >> 0x12) - 6;
  uVar3 = uVar4 >> 2;
  if ((uVar5 & 0xf000000) == 0xe000000) {
    if (uVar3 == 2) {
      if ((char)(uVar5 >> 0x10) == '\x0f') {
        return 4;
      }
      if (((uVar5 >> 0x10 & 0xff) == 0x1f) && ((DFD[0xb] & 0xf000000) == 0xd000000)) {
        return 8;
      }
    }
    else if ((uVar3 == 1) && ((uVar5 & 0xff0000) == 0x170000)) {
      return 4;
    }
  }
  if ((char)DFD[3] == -0x5d) {
    return 8;
  }
  if (uVar4 < 4) {
    uVar1 = 6;
    iVar6 = 1;
  }
  else {
    puVar2 = DFD + 7;
    uVar1 = 0;
    uVar7 = 0;
    uVar5 = 0;
    do {
      if (uVar5 < (ushort)*puVar2) {
        uVar7 = uVar1 & 0xffffffff;
        uVar5 = (uint)(ushort)*puVar2;
      }
      uVar1 = uVar1 + 1;
      puVar2 = puVar2 + 4;
    } while (uVar3 + (uVar3 == 0) != uVar1);
    uVar1 = (ulong)((int)uVar7 * 4 + 6);
    iVar6 = uVar5 + 1;
  }
  return (uint)*(byte *)((long)DFD + uVar1 * 4 + 6) + iVar6 >> 3;
}

Assistant:

uint32_t
reconstructDFDBytesPlane0FromSamples(const uint32_t* DFD)
{
    const uint32_t *BDFDB = DFD+1;
    uint32_t numSamples = KHR_DFDSAMPLECOUNT(BDFDB);
    uint32_t sampleNumber;

    uint32_t bitsPlane0 = 0;
    int32_t largestOffset = 0;
    uint32_t sampleNumberWithLargestOffset = 0;

    // Special case these depth{,-stencil} formats. The unused bits are
    // in the MSBs so have no visibility in the DFD therefore the max offset
    // algorithm below returns a value that is too small.
    if (KHR_DFDSVAL(BDFDB, 0, CHANNELID) == KHR_DF_CHANNEL_COMMON_DEPTH) {
        if (numSamples == 1) {
            if (KHR_DFDSVAL(BDFDB, 0, BITLENGTH) + 1 == 24) {
                // X8_D24_UNORM_PACK32,
                return 4;
            }
        } else if (numSamples == 2) {
            if (KHR_DFDSVAL(BDFDB, 0, BITLENGTH) + 1 == 16) {
                // D16_UNORM_S8_UINT
                return 4;
            }
            if (KHR_DFDSVAL(BDFDB, 0, BITLENGTH) + 1 == 32
                && KHR_DFDSVAL(BDFDB, 1, CHANNELID) == KHR_DF_CHANNEL_COMMON_STENCIL) {
                // D32_SFLOAT_S8_UINT
                return 8;
            }
        }
    }
    if (KHR_DFDVAL(BDFDB, MODEL) == KHR_DF_MODEL_ETC1S) {
        // Size of the first plane.
        return 8;
    }
    for (sampleNumber = 0; sampleNumber < numSamples; ++sampleNumber) {
        int32_t sampleBitOffset = KHR_DFDSVAL(BDFDB, sampleNumber, BITOFFSET);
        if (sampleBitOffset > largestOffset) {
            largestOffset = sampleBitOffset;
            sampleNumberWithLargestOffset = sampleNumber;
        }
    }

    /* The sample bitLength field stores the bit length - 1. */
    uint32_t sampleBitLength = KHR_DFDSVAL(BDFDB, sampleNumberWithLargestOffset, BITLENGTH) + 1;
    bitsPlane0 = largestOffset + sampleBitLength;
    return bitsPlane0 >> 3U;
}